

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Nsf_Emu.cpp
# Opt level: O0

blargg_err_t __thiscall Nsf_Emu::init_sound(Nsf_Emu *this)

{
  void *pvVar1;
  Classic_Emu *in_RDI;
  int count_4;
  int count_3;
  int count_2;
  int count_1;
  double adjusted_gain;
  int count;
  double in_stack_ffffffffffffff58;
  Nes_Apu *in_stack_ffffffffffffff60;
  Nes_Apu *in_stack_ffffffffffffff68;
  Nes_Vrc6_Apu *in_stack_ffffffffffffff70;
  Nes_Vrc6_Apu *local_88;
  void *local_78;
  char *local_8;
  
  if ((int)(in_RDI[0xd].super_Music_Emu.super_Gme_File.track_count_ & -0x32000000) != 0) {
    Gme_File::set_warning((Gme_File *)in_RDI,"Uses unsupported audio expansion hardware");
  }
  Music_Emu::set_voice_count(&in_RDI->super_Music_Emu,5);
  Music_Emu::set_voice_names(&in_RDI->super_Music_Emu,init_sound::apu_names);
  Classic_Emu::set_voice_types(in_RDI,init_sound::types);
  Music_Emu::gain(&in_RDI->super_Music_Emu);
  if ((in_RDI[0xd].super_Music_Emu.super_Gme_File.track_count_ & 0x31000000) != 0) {
    Music_Emu::set_voice_count(&in_RDI->super_Music_Emu,8);
  }
  if ((in_RDI[0xd].super_Music_Emu.super_Gme_File.track_count_ & 0x10000000) != 0) {
    pvVar1 = Nes_Namco_Apu::operator_new(0x95ea90);
    local_78 = (void *)0x0;
    if (pvVar1 != (void *)0x0) {
      Nes_Namco_Apu::Nes_Namco_Apu((Nes_Namco_Apu *)in_stack_ffffffffffffff60);
      local_78 = pvVar1;
    }
    *(void **)(in_RDI[6].super_Music_Emu.super_Gme_File.playlist_warning + 0x28) = local_78;
    if (*(long *)(in_RDI[6].super_Music_Emu.super_Gme_File.playlist_warning + 0x28) == 0) {
      local_8 = "Out of memory";
      return local_8;
    }
    Music_Emu::set_voice_count(&in_RDI->super_Music_Emu,0xd);
    Music_Emu::set_voice_names(&in_RDI->super_Music_Emu,init_sound::names);
  }
  if ((in_RDI[0xd].super_Music_Emu.super_Gme_File.track_count_ & 0x1000000) != 0) {
    in_stack_ffffffffffffff70 = (Nes_Vrc6_Apu *)Nes_Vrc6_Apu::operator_new(0x95eb92);
    local_88 = (Nes_Vrc6_Apu *)0x0;
    if (in_stack_ffffffffffffff70 != (Nes_Vrc6_Apu *)0x0) {
      Nes_Vrc6_Apu::Nes_Vrc6_Apu((Nes_Vrc6_Apu *)in_stack_ffffffffffffff60);
      local_88 = in_stack_ffffffffffffff70;
    }
    *(Nes_Vrc6_Apu **)(in_RDI[6].super_Music_Emu.super_Gme_File.playlist_warning + 0x30) = local_88;
    if (*(long *)(in_RDI[6].super_Music_Emu.super_Gme_File.playlist_warning + 0x30) == 0) {
      local_8 = "Out of memory";
      return local_8;
    }
    Music_Emu::set_voice_count(&in_RDI->super_Music_Emu,8);
    Music_Emu::set_voice_names(&in_RDI->super_Music_Emu,init_sound()::names);
    if ((in_RDI[0xd].super_Music_Emu.super_Gme_File.track_count_ & 0x10000000) != 0) {
      Music_Emu::set_voice_count(&in_RDI->super_Music_Emu,0x10);
      Music_Emu::set_voice_names(&in_RDI->super_Music_Emu,init_sound()::names);
    }
  }
  if ((in_RDI[0xd].super_Music_Emu.super_Gme_File.track_count_ & 0x20000000) != 0) {
    in_stack_ffffffffffffff60 = (Nes_Apu *)Nes_Fme7_Apu::operator_new(0x95eccc);
    in_stack_ffffffffffffff68 = (Nes_Apu *)0x0;
    if (in_stack_ffffffffffffff60 != (Nes_Apu *)0x0) {
      Nes_Fme7_Apu::Nes_Fme7_Apu((Nes_Fme7_Apu *)in_stack_ffffffffffffff60);
      in_stack_ffffffffffffff68 = in_stack_ffffffffffffff60;
    }
    *(Nes_Apu **)(in_RDI[6].super_Music_Emu.super_Gme_File.playlist_warning + 0x38) =
         in_stack_ffffffffffffff68;
    if (*(long *)(in_RDI[6].super_Music_Emu.super_Gme_File.playlist_warning + 0x38) == 0) {
      local_8 = "Out of memory";
      return local_8;
    }
    Music_Emu::set_voice_count(&in_RDI->super_Music_Emu,8);
    Music_Emu::set_voice_names(&in_RDI->super_Music_Emu,init_sound()::names);
  }
  if (*(long *)(in_RDI[6].super_Music_Emu.super_Gme_File.playlist_warning + 0x28) != 0) {
    Nes_Namco_Apu::volume((Nes_Namco_Apu *)in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
  }
  if (*(long *)(in_RDI[6].super_Music_Emu.super_Gme_File.playlist_warning + 0x30) != 0) {
    Nes_Vrc6_Apu::volume(in_stack_ffffffffffffff70,(double)in_stack_ffffffffffffff68);
  }
  if (*(long *)(in_RDI[6].super_Music_Emu.super_Gme_File.playlist_warning + 0x38) != 0) {
    Nes_Fme7_Apu::volume((Nes_Fme7_Apu *)in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
  }
  Nes_Apu::volume(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
  return (blargg_err_t)0x0;
}

Assistant:

blargg_err_t Nsf_Emu::init_sound()
{
	if ( header_.chip_flags & ~(namco_flag | vrc6_flag | fme7_flag) )
		set_warning( "Uses unsupported audio expansion hardware" );
	
	{
		#define APU_NAMES "Square 1", "Square 2", "Triangle", "Noise", "DMC"
		
		int const count = Nes_Apu::osc_count;
		static const char* const apu_names [count] = { APU_NAMES };
		set_voice_count( count );
		set_voice_names( apu_names );
		
	}
	
	static int const types [] = {
		wave_type  | 1, wave_type  | 2, wave_type | 0,
		noise_type | 0, mixed_type | 1,
		wave_type  | 3, wave_type  | 4, wave_type | 5,
		wave_type  | 6, wave_type  | 7, wave_type | 8, wave_type | 9,
		wave_type  |10, wave_type  |11, wave_type |12, wave_type |13
	};
	set_voice_types( types ); // common to all sound chip configurations
	
	double adjusted_gain = gain();
	
	#if NSF_EMU_APU_ONLY
	{
		if ( header_.chip_flags )
			set_warning( "Uses unsupported audio expansion hardware" );
	}
	#else
	{
		if ( header_.chip_flags & (namco_flag | vrc6_flag | fme7_flag) )
			set_voice_count( Nes_Apu::osc_count + 3 );
		
		if ( header_.chip_flags & namco_flag )
		{
			namco = BLARGG_NEW Nes_Namco_Apu;
			CHECK_ALLOC( namco );
			adjusted_gain *= 0.75;
			
			int const count = Nes_Apu::osc_count + Nes_Namco_Apu::osc_count;
			static const char* const names [count] = {
				APU_NAMES,
				"Wave 1", "Wave 2", "Wave 3", "Wave 4",
				"Wave 5", "Wave 6", "Wave 7", "Wave 8"
			};
			set_voice_count( count );
			set_voice_names( names );
		}
		
		if ( header_.chip_flags & vrc6_flag )
		{
			vrc6 = BLARGG_NEW Nes_Vrc6_Apu;
			CHECK_ALLOC( vrc6 );
			adjusted_gain *= 0.75;
			
			{
				int const count = Nes_Apu::osc_count + Nes_Vrc6_Apu::osc_count;
				static const char* const names [count] = {
					APU_NAMES,
					"Saw Wave", "Square 3", "Square 4"
				};
				set_voice_count( count );
				set_voice_names( names );
			}
			
			if ( header_.chip_flags & namco_flag )
			{
				int const count = Nes_Apu::osc_count + Nes_Vrc6_Apu::osc_count +
						Nes_Namco_Apu::osc_count;
				static const char* const names [count] = {
					APU_NAMES,
					"Saw Wave", "Square 3", "Square 4",
					"Wave 1", "Wave 2", "Wave 3", "Wave 4",
					"Wave 5", "Wave 6", "Wave 7", "Wave 8"
				};
				set_voice_count( count );
				set_voice_names( names );
			}
		}
		
		if ( header_.chip_flags & fme7_flag )
		{
			fme7 = BLARGG_NEW Nes_Fme7_Apu;
			CHECK_ALLOC( fme7 );
			adjusted_gain *= 0.75;
			
			int const count = Nes_Apu::osc_count + Nes_Fme7_Apu::osc_count;
			static const char* const names [count] = {
				APU_NAMES,
				"Square 3", "Square 4", "Square 5"
			};
			set_voice_count( count );
			set_voice_names( names );
		}
		
		if ( namco ) namco->volume( adjusted_gain );
		if ( vrc6  ) vrc6 ->volume( adjusted_gain );
		if ( fme7  ) fme7 ->volume( adjusted_gain );
	}
	#endif
	
	apu.volume( adjusted_gain );
	
	return 0;
}